

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

UInt __thiscall Json::Value::asUInt(Value *this)

{
  bool bVar1;
  runtime_error *prVar2;
  Value *this_local;
  
  switch(this->field_0x8) {
  case 0:
    this_local._4_4_ = 0;
    break;
  case 1:
    bVar1 = isUInt(this);
    if (!bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"LargestInt out of UInt range");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._4_4_ = (uint)(this->value_).uint_;
    break;
  case 2:
    bVar1 = isUInt(this);
    if (!bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"LargestUInt out of UInt range");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._4_4_ = (uint)(this->value_).uint_;
    break;
  case 3:
    bVar1 = InRange<int,unsigned_int>((this->value_).real_,0,0xffffffff);
    if (!bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"double out of UInt range");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._4_4_ = (uint)(long)(this->value_).real_;
    break;
  default:
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Value is not convertible to UInt.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    this_local._4_4_ = (uint)(((this->value_).bool_ & 1U) != 0);
  }
  return this_local._4_4_;
}

Assistant:

Value::UInt Value::asUInt() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestInt out of UInt range");
    return UInt(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestUInt out of UInt range");
    return UInt(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, 0, maxUInt),
                        "double out of UInt range");
    return UInt(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to UInt.");
}